

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_mu_timeout_stress_test.c
# Opt level: O2

void mu_stress_reader_loop(cv_stress_data *s,condition_func condition,void *condition_arg)

{
  uint *puVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  nsync_time nVar6;
  nsync_time nVar7;
  ulong in_stack_ffffffffffffffc0;
  
  nsync::nsync_mu_rlock(&s->mu);
  nsync::nsync_mu_rassert_held(&s->mu);
  uVar5 = 0;
  while (uVar2 = s->refs, nsync::nsync_mu_rassert_held(&s->mu), uVar2 != 0) {
    while( true ) {
      nVar6 = nsync::nsync_time_now();
      iVar4 = rand();
      nVar7 = nsync::nsync_time_us(iVar4 % 4000);
      nVar6 = nsync::nsync_time_add(nVar6,nVar7);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_stack_ffffffffffffffc0;
      iVar4 = nsync::nsync_mu_wait_with_deadline
                        ((nsync *)s,(nsync_mu *)condition,(_func_int_void_ptr *)condition_arg,
                         (void *)0x0,(_func_int_void_ptr_void_ptr *)nVar6.tv_sec,
                         (nsync_time)(auVar3 << 0x40),(nsync_note)nVar6.tv_nsec);
      nsync::nsync_mu_rassert_held(&s->mu);
      if (iVar4 == 0) break;
      s->timeouts = s->timeouts + 1;
      nsync::nsync_mu_rassert_held(&s->mu);
    }
    uVar5 = uVar5 + 1;
    if ((uVar5 & 0xf) == 0) {
      nsync::nsync_mu_runlock(&s->mu);
      if ((uVar5 & 0xff0) == 0) {
        nVar6 = nsync::nsync_time_ms(1);
        nVar7.tv_nsec = nVar6.tv_nsec;
        nVar7.tv_sec = nVar7.tv_nsec;
        nsync::nsync_time_sleep((nsync *)nVar6.tv_sec,nVar7);
      }
      nsync::nsync_mu_rlock(&s->mu);
    }
  }
  nsync::nsync_mu_runlock(&s->mu);
  nsync::nsync_mu_lock(&s->mu);
  s->reader_loops = s->reader_loops + uVar5;
  puVar1 = &s->reader_refs;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    nsync::nsync_cv_signal(&s->reader_refs_is_zero);
  }
  nsync::nsync_mu_assert_held(&s->mu);
  nsync::nsync_mu_unlock(&s->mu);
  return;
}

Assistant:

static void mu_stress_reader_loop (cv_stress_data *s, condition_func condition,
				   const void *condition_arg) {
	uintmax_t loops;
	uintmax_t timeouts = 0;
	nsync_mu_rlock (&s->mu);
	nsync_mu_rassert_held (&s->mu);
	loops = 0;
	while (s->refs != 0) {
		nsync_time abs_deadline;
		nsync_mu_rassert_held (&s->mu);
		abs_deadline = nsync_time_add (nsync_time_now (),
			nsync_time_us (rand () % STRESS_MAX_DELAY_MICROS));
		while (nsync_mu_wait_with_deadline (&s->mu, condition, condition_arg, NULL,
						    abs_deadline, NULL) != 0) {
			nsync_mu_rassert_held (&s->mu);
			s->timeouts++;
			nsync_mu_rassert_held (&s->mu);
			abs_deadline = nsync_time_add (nsync_time_now (),
				nsync_time_us (rand () % STRESS_MAX_DELAY_MICROS));
		}

		nsync_mu_rassert_held (&s->mu);
		loops++;
		if ((loops & 0xf) == 0) {
			nsync_mu_runlock (&s->mu);
			if ((loops & 0xfff) == 0) {
				nsync_time_sleep (nsync_time_ms (1));
			}
			nsync_mu_rlock (&s->mu);
		}
	}
	nsync_mu_rassert_held (&s->mu);
	nsync_mu_runlock (&s->mu);

	nsync_mu_lock (&s->mu);
	s->reader_loops += loops;
	s->timeouts += timeouts;
	s->reader_refs--;
	if (s->reader_refs == 0) {
		nsync_cv_signal (&s->reader_refs_is_zero);
	}
	nsync_mu_assert_held (&s->mu);
	nsync_mu_unlock (&s->mu);
}